

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubsms_test.cc
# Opt level: O0

int test_set_user_business_status(void)

{
  code *pcVar1;
  char *__s;
  UbsmsSetUserBusinessStatusRequestType *pUVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_171;
  int ret;
  HttpTestListener *local_150;
  HttpTestListener *listener;
  string local_140;
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [55];
  allocator<char> local_b9;
  string local_b8 [32];
  UbsmsSetUserBusinessStatusRequestType *local_98;
  Ubsms *ubsms;
  undefined1 local_88 [7];
  UbsmsSetUserBusinessStatusResponseType resp;
  UbsmsSetUserBusinessStatusRequestType req;
  
  aliyun::UbsmsSetUserBusinessStatusRequestType::UbsmsSetUserBusinessStatusRequestType
            ((UbsmsSetUserBusinessStatusRequestType *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"cn-hangzhou",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"my_appid",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"my_secret",&local_119);
  pUVar2 = (UbsmsSetUserBusinessStatusRequestType *)
           aliyun::Ubsms::CreateUbsmsClient(local_b8,local_f0,local_118);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_98 = pUVar2;
  if (pUVar2 == (UbsmsSetUserBusinessStatusRequestType *)0x0) {
    aliyun::UbsmsSetUserBusinessStatusRequestType::~UbsmsSetUserBusinessStatusRequestType
              ((UbsmsSetUserBusinessStatusRequestType *)local_88);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ubsms::SetProxyHost((Ubsms *)pUVar2,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ubsms::SetUseTls((Ubsms *)local_98,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_set_user_business_status_response;
  local_150 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_171);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_171);
  HttpTestListener::Start(local_150);
  std::__cxx11::string::operator=((string *)local_88,"Uid");
  std::__cxx11::string::operator=((string *)(req.uid.field_2._M_local_buf + 8),"Service");
  std::__cxx11::string::operator=((string *)(req.service.field_2._M_local_buf + 8),"StatusKey");
  std::__cxx11::string::operator=((string *)(req.status_key.field_2._M_local_buf + 8),"StatusValue")
  ;
  aliyun::Ubsms::SetUserBusinessStatus
            (local_98,(UbsmsSetUserBusinessStatusResponseType *)local_88,
             (UbsmsErrorInfo *)((long)&ubsms + 7));
  HttpTestListener::WaitComplete(local_150);
  pHVar3 = local_150;
  if (local_150 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_150);
    operator_delete(pHVar3,0x180);
  }
  pUVar2 = local_98;
  if (local_98 != (UbsmsSetUserBusinessStatusRequestType *)0x0) {
    aliyun::Ubsms::~Ubsms((Ubsms *)local_98);
    operator_delete(pUVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_set_user_business_status() {
  UbsmsSetUserBusinessStatusRequestType req;
  UbsmsSetUserBusinessStatusResponseType resp;
  Ubsms* ubsms = Ubsms::CreateUbsmsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ubsms) return 0;
  ubsms->SetProxyHost("127.0.0.1:12234");
  ubsms->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_set_user_business_status_response);
  listener->Start();
  req.uid = "Uid";
  req.service = "Service";
  req.status_key = "StatusKey";
  req.status_value = "StatusValue";
  int ret = ubsms->SetUserBusinessStatus(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ubsms;
}